

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceVkImpl::CreateShader
          (RenderDeviceVkImpl *this,ShaderCreateInfo *ShaderCI,IShader **ppShader,
          IDataBlob **ppCompilerOutput)

{
  VulkanLogicalDevice *this_00;
  ExtensionFeatures *pEVar1;
  undefined1 local_58 [8];
  CreateInfo VkShaderCI;
  IDataBlob **ppCompilerOutput_local;
  IShader **ppShader_local;
  ShaderCreateInfo *ShaderCI_local;
  RenderDeviceVkImpl *this_local;
  
  VkShaderCI.pCompilationThreadPool = (IThreadPool *)ppCompilerOutput;
  local_58 = (undefined1  [8])GetDxCompiler(this);
  VkShaderCI.pDXCompiler =
       (IDXCompiler *)
       RenderDeviceBase<Diligent::EngineVkImplTraits>::GetDeviceInfo
                 ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this);
  VkShaderCI.DeviceInfo =
       (RenderDeviceInfo *)
       RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                 ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this);
  VkShaderCI.AdapterInfo._0_4_ = GetVkVersion(this);
  this_00 = GetLogicalDevice(this);
  pEVar1 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(this_00);
  VkShaderCI.AdapterInfo._4_1_ = pEVar1->Spirv14 & 1;
  VkShaderCI._24_8_ = VkShaderCI.pCompilationThreadPool;
  VkShaderCI.ppCompilerOutput =
       (IDataBlob **)
       Diligent::RefCntAutoPtr::operator_cast_to_IThreadPool_
                 ((RefCntAutoPtr *)
                  &(this->
                   super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                   m_pShaderCompilationThreadPool);
  RenderDeviceBase<Diligent::EngineVkImplTraits>::
  CreateShaderImpl<Diligent::ShaderVkImpl::CreateInfo>
            ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this,ppShader,ShaderCI,
             (CreateInfo *)local_58);
  return;
}

Assistant:

void RenderDeviceVkImpl::CreateShader(const ShaderCreateInfo& ShaderCI,
                                      IShader**               ppShader,
                                      IDataBlob**             ppCompilerOutput)
{
    const ShaderVkImpl::CreateInfo VkShaderCI{
        GetDxCompiler(),
        GetDeviceInfo(),
        GetAdapterInfo(),
        GetVkVersion(),
        GetLogicalDevice().GetEnabledExtFeatures().Spirv14,
        ppCompilerOutput,
        m_pShaderCompilationThreadPool,
    };
    CreateShaderImpl(ppShader, ShaderCI, VkShaderCI);
}